

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int gen_publickey_from_rsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,RSA **rsa_ctx)

{
  rsa_st *key;
  int iVar1;
  EVP_PKEY *pkey;
  char *errmsg;
  RSA *rsa;
  uchar *coeff;
  uchar *q;
  uchar *p;
  uchar *d;
  uchar *e;
  uchar *n;
  size_t coefflen;
  size_t qlen;
  size_t plen;
  size_t dlen;
  size_t elen;
  size_t nlen;
  uchar *comment;
  size_t commentlen;
  rsa_st *local_a8;
  uchar *local_a0;
  uchar *local_98;
  uchar *local_90;
  uchar *local_88;
  uchar *local_80;
  uchar *local_78;
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  uchar *local_40;
  size_t local_38;
  
  local_a8 = (rsa_st *)0x0;
  iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_78,&local_48);
  if (iVar1 == 0) {
    iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_80,&local_50);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_88,&local_58);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_a0,&local_70);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_90,&local_60);
          if (iVar1 == 0) {
            iVar1 = _libssh2_get_bignum_bytes(decrypted,&local_98,&local_68);
            if (iVar1 == 0) {
              iVar1 = _libssh2_get_string(decrypted,&local_40,&local_38);
              if (iVar1 == 0) {
                _libssh2_rsa_new((RSA **)&local_a8,local_80,local_50,local_78,local_48,local_88,
                                 local_58,local_90,local_60,local_98,local_68,(uchar *)0x0,0,
                                 (uchar *)0x0,0,local_a0,local_70);
                key = local_a8;
                if (local_a8 == (rsa_st *)0x0) {
                  iVar1 = 0;
                }
                else {
                  iVar1 = _libssh2_rsa_new_additional_parameters((RSA *)local_a8);
                }
                if (((method != (uchar **)0x0) && (pubkeydata != (uchar **)0x0)) &&
                   (key != (rsa_st *)0x0)) {
                  pkey = EVP_PKEY_new();
                  EVP_PKEY_set1_RSA(pkey,key);
                  iVar1 = gen_publickey_from_rsa_evp
                                    (session,method,method_len,pubkeydata,pubkeydata_len,
                                     (EVP_PKEY *)pkey);
                  if (pkey != (EVP_PKEY *)0x0) {
                    EVP_PKEY_free(pkey);
                  }
                }
                if (rsa_ctx != (RSA **)0x0) {
                  *rsa_ctx = (RSA *)key;
                  return iVar1;
                }
                RSA_free(key);
                return iVar1;
              }
              errmsg = "RSA no comment";
            }
            else {
              errmsg = "RSA no q";
            }
          }
          else {
            errmsg = "RSA no p";
          }
        }
        else {
          errmsg = "RSA no coeff";
        }
      }
      else {
        errmsg = "RSA no d";
      }
    }
    else {
      errmsg = "RSA no e";
    }
  }
  else {
    errmsg = "RSA no n";
  }
  _libssh2_error(session,-0xe,errmsg);
  return -1;
}

Assistant:

static int
gen_publickey_from_rsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                         struct string_buf *decrypted,
                                         unsigned char **method,
                                         size_t *method_len,
                                         unsigned char **pubkeydata,
                                         size_t *pubkeydata_len,
                                         libssh2_rsa_ctx **rsa_ctx)
{
    int rc = 0;
    size_t nlen, elen, dlen, plen, qlen, coefflen, commentlen;
    unsigned char *n, *e, *d, *p, *q, *coeff, *comment;
    RSA *rsa = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing RSA keys from private key data"));

    /* public key data */
    if(_libssh2_get_bignum_bytes(decrypted, &n, &nlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no n");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &e, &elen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no e");
        return -1;
    }

    /* private key data */
    if(_libssh2_get_bignum_bytes(decrypted, &d, &dlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no d");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &coeff, &coefflen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no coeff");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &p, &plen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no p");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &q, &qlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no q");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &comment, &commentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no comment");
        return -1;
    }

    rc = _libssh2_rsa_new(&rsa,
                          e, (unsigned long)elen,
                          n, (unsigned long)nlen,
                          d, (unsigned long)dlen,
                          p, (unsigned long)plen,
                          q, (unsigned long)qlen,
                          NULL, 0, NULL, 0,
                          coeff, (unsigned long)coefflen);
    if(rc) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Could not create RSA private key"));
        goto fail;
    }

    if(rsa)
        rc = _libssh2_rsa_new_additional_parameters(rsa);

    if(rsa && pubkeydata && method) {
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_RSA(pk, rsa);

        rc = gen_publickey_from_rsa_evp(session, method, method_len,
                                        pubkeydata, pubkeydata_len,
                                        pk);

        if(pk)
            EVP_PKEY_free(pk);
    }

    if(rsa_ctx)
        *rsa_ctx = rsa;
    else
        RSA_free(rsa);

    return rc;

fail:

    if(rsa)
        RSA_free(rsa);

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}